

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O1

int tcv_get_fibre_channel_media(tcv_t *tcv,tcv_fibre_channel_media_t *media)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  
  if ((tcv == (tcv_t *)0x0) || (tcv->created != true)) {
    bVar3 = false;
  }
  else {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&tcv->lock);
    bVar3 = iVar2 == 0;
  }
  iVar2 = -4;
  if ((media != (tcv_fibre_channel_media_t *)0x0) && (bVar3)) {
    if ((tcv == (tcv_t *)0x0) || (tcv->created != true)) {
      cVar1 = '\0';
    }
    else {
      cVar1 = tcv->initialized;
    }
    if (cVar1 == '\0') {
      iVar2 = 0;
    }
    else {
      iVar2 = (*tcv->fun->get_fibre_channel_media)(tcv,media);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
  }
  return iVar2;
}

Assistant:

int tcv_get_fibre_channel_media(tcv_t *tcv, tcv_fibre_channel_media_t *media)
{
	int ret = TCV_ERR_NOT_INITIALIZED;

	if (!tcv_check_and_lock_ok(tcv) || !media)
		return TCV_ERR_INVALID_ARG;

	ret = tcv_is_initialized(tcv);
	if (ret) {
		ret = tcv->fun->get_fibre_channel_media(tcv, media);
	}

	tcv_unlock(tcv);
	return ret;
}